

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O1

int __thiscall QMetaObjectBuilder::addRelatedMetaObject(QMetaObjectBuilder *this,QMetaObject *meta)

{
  qsizetype i;
  QList<const_QMetaObject_*> *this_00;
  long in_FS_OFFSET;
  QMetaObject *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  i = (this->d->relatedMetaObjects).d.size;
  this_00 = &this->d->relatedMetaObjects;
  local_20 = meta;
  QtPrivate::QPodArrayOps<QMetaObject_const*>::emplace<QMetaObject_const*&>
            ((QPodArrayOps<QMetaObject_const*> *)this_00,i,&local_20);
  QList<const_QMetaObject_*>::end(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)i;
  }
  __stack_chk_fail();
}

Assistant:

int QMetaObjectBuilder::addRelatedMetaObject(const QMetaObject *meta)
{
    Q_ASSERT(meta);
    int index = d->relatedMetaObjects.size();
    d->relatedMetaObjects.append(meta);
    return index;
}